

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

optional<double> __thiscall wasm::WATParser::anon_unknown_11::ParseInput::takeF64(ParseInput *this)

{
  bool bVar1;
  Token *this_00;
  undefined8 extraout_RAX;
  undefined8 uVar2;
  optional<double> oVar3;
  undefined1 local_68 [8];
  optional<wasm::WATParser::Token> t;
  ParseInput *this_local;
  optional<double> d;
  
  t.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
  super__Optional_payload_base<wasm::WATParser::Token>._64_8_ = this;
  peek((optional<wasm::WATParser::Token> *)local_68,this);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_68);
  if (bVar1) {
    this_00 = std::optional<wasm::WATParser::Token>::operator->
                        ((optional<wasm::WATParser::Token> *)local_68);
    oVar3 = Token::getF64(this_00);
    this_local = oVar3.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
    d.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _M_payload._0_1_ =
         oVar3.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>._M_engaged;
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this_local);
    if (bVar1) {
      Lexer::operator++(&this->lexer);
      bVar1 = true;
      goto LAB_01d85e39;
    }
  }
  bVar1 = false;
LAB_01d85e39:
  std::optional<wasm::WATParser::Token>::~optional((optional<wasm::WATParser::Token> *)local_68);
  uVar2 = 0;
  if (!bVar1) {
    std::optional<double>::optional((optional<double> *)&this_local);
    uVar2 = extraout_RAX;
  }
  oVar3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _9_7_ = (undefined7)((ulong)uVar2 >> 8);
  oVar3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_engaged = (bool)d.super__Optional_base<double,_true,_true>._M_payload.
                     super__Optional_payload_base<double>._M_payload._0_1_;
  oVar3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload = (_Storage<double,_true>)this_local;
  return (optional<double>)
         oVar3.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>;
}

Assistant:

std::optional<double> takeF64() {
    if (auto t = peek()) {
      if (auto d = t->getF64()) {
        ++lexer;
        return d;
      }
    }
    return std::nullopt;
  }